

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O0

int ZSTD_litLengthContribution(U32 litLength,optState_t *optPtr,int optLevel)

{
  U32 UVar1;
  U32 UVar2;
  U32 local_38;
  U32 local_30;
  U32 local_28;
  int contribution;
  U32 llCode;
  int optLevel_local;
  optState_t *optPtr_local;
  U32 litLength_local;
  
  if (optPtr->priceType == zop_dynamic) {
    UVar2 = ZSTD_LLcode(litLength);
    UVar1 = LL_bits[UVar2];
    if (optLevel == 0) {
      local_30 = ZSTD_bitWeight(*optPtr->litLengthFreq);
    }
    else {
      local_30 = ZSTD_fracWeight(*optPtr->litLengthFreq);
    }
    if (optLevel == 0) {
      local_38 = ZSTD_bitWeight(optPtr->litLengthFreq[UVar2]);
    }
    else {
      local_38 = ZSTD_fracWeight(optPtr->litLengthFreq[UVar2]);
    }
    optPtr_local._4_4_ = (UVar1 * 0x100 + local_30) - local_38;
  }
  else {
    if (optLevel == 0) {
      local_28 = ZSTD_bitWeight(litLength);
    }
    else {
      local_28 = ZSTD_fracWeight(litLength);
    }
    optPtr_local._4_4_ = local_28;
  }
  return optPtr_local._4_4_;
}

Assistant:

static int ZSTD_litLengthContribution(U32 const litLength, const optState_t* const optPtr, int optLevel)
{
    if (optPtr->priceType >= zop_predef) return WEIGHT(litLength, optLevel);

    /* dynamic statistics */
    {   U32 const llCode = ZSTD_LLcode(litLength);
        int const contribution = (LL_bits[llCode] * BITCOST_MULTIPLIER)
                               + WEIGHT(optPtr->litLengthFreq[0], optLevel)   /* note: log2litLengthSum cancel out */
                               - WEIGHT(optPtr->litLengthFreq[llCode], optLevel);
#if 1
        return contribution;
#else
        return MAX(0, contribution); /* sometimes better, sometimes not ... */
#endif
    }
}